

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O3

ChStreamInBinary * __thiscall chrono::ChStreamInBinary::operator>>(ChStreamInBinary *this,long *Val)

{
  undefined1 uVar1;
  long in_RAX;
  undefined1 *puVar2;
  long lVar3;
  char *acBytes;
  long tmp;
  undefined8 local_18;
  
  if ((this->super_ChBinaryArchive).big_endian_machine == true) {
    local_18 = in_RAX;
    (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,&local_18,8);
    puVar2 = (undefined1 *)((long)&local_18 + 7);
    lVar3 = 0;
    do {
      uVar1 = *(undefined1 *)((long)&local_18 + lVar3);
      *(undefined1 *)((long)&local_18 + lVar3) = *puVar2;
      *puVar2 = uVar1;
      lVar3 = lVar3 + 1;
      puVar2 = puVar2 + -1;
    } while (lVar3 != 4);
    *Val = local_18;
  }
  else {
    (*(this->super_ChStreamIn)._vptr_ChStreamIn[3])(this,Val,8);
  }
  return this;
}

Assistant:

ChStreamInBinary& ChStreamInBinary::operator>>(long& Val) {
    if (big_endian_machine) {
        long tmp;
        this->Input((char*)&tmp, sizeof(long));
        StreamSwapBytes<long>(&tmp);
        Val = tmp;
    } else {
        this->Input((char*)&Val, sizeof(long));
    }
    return (*this);
}